

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O1

LY_ERR lys_compile_node_action_inout(lysc_ctx *ctx,lysp_node *pnode,lysc_node *node)

{
  uint32_t uVar1;
  lys_module *plVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  LY_ERR LVar6;
  LY_ERR LVar7;
  long *plVar8;
  lysp_ext_instance *plVar9;
  long lVar10;
  lysp_restr *must_p;
  lysp_ext_instance *plVar11;
  lysp_node *plVar12;
  
  uVar1 = ctx->compile_opts;
  plVar12 = pnode[1].parent;
  if (plVar12 != (lysp_node *)0x0) {
    plVar2 = node[1].module;
    if (plVar2 == (lys_module *)0x0) {
      lVar10 = 0;
      plVar8 = (long *)calloc(1,(long)plVar12[-1].exts * 0x38 + 8);
    }
    else {
      lVar10 = *(long *)&plVar2[-1].implemented;
      plVar8 = (long *)realloc(&plVar2[-1].implemented,
                               ((long)&(plVar12[-1].exts)->name +
                               *(long *)&plVar2[-1].implemented + lVar10) * 0x38 + 8);
    }
    if (plVar8 == (long *)0x0) {
      bVar4 = false;
      LVar7 = LY_EMEM;
      ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).");
      bVar5 = true;
    }
    else {
      node[1].module = (lys_module *)(plVar8 + 1);
      LVar7 = LY_SUCCESS;
      if (pnode[1].parent == (lysp_node *)0x0) {
        plVar11 = (lysp_ext_instance *)0x0;
      }
      else {
        plVar11 = pnode[1].parent[-1].exts;
      }
      memset(plVar8 + *plVar8 * 7 + 1,0,((long)&plVar11->name + lVar10) * 0x38);
      bVar4 = true;
      bVar5 = false;
    }
    if (bVar4) {
      plVar11 = (lysp_ext_instance *)0xffffffffffffffff;
      lVar10 = 0;
      LVar6 = LVar7;
      do {
        LVar7 = LVar6;
        plVar12 = pnode[1].parent;
        if (plVar12 == (lysp_node *)0x0) {
          plVar9 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar9 = plVar12[-1].exts;
        }
        plVar11 = (lysp_ext_instance *)((long)&plVar11->name + 1);
        if (plVar9 <= plVar11) {
          bVar5 = false;
          goto LAB_0014a592;
        }
        plVar2 = node[1].module;
        uVar3 = *(ulong *)&plVar2[-1].implemented;
        must_p = (lysp_restr *)((long)&plVar12->parent + lVar10);
        lVar10 = lVar10 + 0x40;
        *(ulong *)&plVar2[-1].implemented = uVar3 + 1;
        LVar7 = lys_compile_must(ctx,must_p,
                                 (lysc_must *)
                                 (&plVar2->ctx + (-(ulong)(plVar2 == (lys_module *)0x0) | uVar3) * 7
                                 ));
        LVar6 = LY_SUCCESS;
      } while (LVar7 == LY_SUCCESS);
      bVar5 = true;
    }
LAB_0014a592:
    if (bVar5) {
      return LVar7;
    }
  }
  ctx->compile_opts = ctx->compile_opts | (uint)(pnode->nodetype != 0x1000) * 0x1000 + 0x1004;
  plVar12 = (lysp_node *)pnode[1].name;
  while( true ) {
    if (plVar12 == (lysp_node *)0x0) {
      LVar7 = lys_compile_node_augments(ctx,node);
      if (LVar7 == LY_SUCCESS) {
        ctx->compile_opts = uVar1;
        LVar7 = LY_SUCCESS;
      }
      return LVar7;
    }
    LVar7 = lys_compile_node(ctx,plVar12,node,0,(ly_set *)0x0);
    if (LVar7 != LY_SUCCESS) break;
    plVar12 = plVar12->next;
  }
  return LVar7;
}

Assistant:

LY_ERR
lys_compile_node_action_inout(struct lysc_ctx *ctx, struct lysp_node *pnode, struct lysc_node *node)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysp_node *child_p;
    uint32_t prev_options = ctx->compile_opts;

    struct lysp_node_action_inout *inout_p = (struct lysp_node_action_inout *)pnode;
    struct lysc_node_action_inout *inout = (struct lysc_node_action_inout *)node;

    COMPILE_ARRAY_GOTO(ctx, inout_p->musts, inout->musts, lys_compile_must, ret, done);
    ctx->compile_opts |= (inout_p->nodetype == LYS_INPUT) ? LYS_COMPILE_RPC_INPUT : LYS_COMPILE_RPC_OUTPUT;

    LY_LIST_FOR(inout_p->child, child_p) {
        LY_CHECK_GOTO(ret = lys_compile_node(ctx, child_p, node, 0, NULL), done);
    }

    /* connect any augments */
    LY_CHECK_GOTO(ret = lys_compile_node_augments(ctx, node), done);

    ctx->compile_opts = prev_options;

done:
    return ret;
}